

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O3

void __thiscall crnlib::dynamic_string::clear(dynamic_string *this)

{
  char *pcVar1;
  
  pcVar1 = this->m_pStr;
  if (pcVar1 != (char *)0x0) {
    if ((*(uint *)(pcVar1 + -8) ^ *(uint *)(pcVar1 + -4)) == 0xffffffff) {
      crnlib_free(pcVar1 + -0x10);
    }
    this->m_pStr = (char *)0x0;
    this->m_buf_size = 0;
    this->m_len = 0;
  }
  return;
}

Assistant:

void dynamic_string::clear()
    {
        check();

        if (m_pStr)
        {
            crnlib_delete_array(m_pStr);
            m_pStr = nullptr;

            m_len = 0;
            m_buf_size = 0;
        }
    }